

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O3

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::convertImageType(toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage)

{
  undefined4 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  ImageT<unsigned_short,_1U> *this_00;
  ImageT<unsigned_char,_1U> *this_01;
  ImageT<unsigned_short,_2U> *this_02;
  ImageT<unsigned_char,_2U> *this_03;
  ImageT<unsigned_short,_4U> *this_04;
  ImageT<unsigned_char,_4U> *this_05;
  ImageT<unsigned_short,_3U> *this_06;
  ImageT<unsigned_char,_3U> *this_07;
  runtime_error *this_08;
  long *in_RDX;
  string nullSwizzle;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  iVar5 = *(int *)&pImage[100]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
                   super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                   super__Head_base<0UL,_Image_*,_false>._M_head_impl;
  iVar4 = (**(code **)(*(long *)*in_RDX + 0x28))();
  if (iVar5 == iVar4) {
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)*in_RDX;
    *in_RDX = 0;
  }
  else {
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"rgba","");
    iVar5 = (**(code **)(*(long *)*in_RDX + 0x30))();
    uVar1 = *(undefined4 *)
             &pImage[100]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
              super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
              super__Head_base<0UL,_Image_*,_false>._M_head_impl;
    if (iVar5 == 2) {
      switch(uVar1) {
      case 0:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x487,"unique_ptr<Image> toktxApp::convertImageType(unique_ptr<Image>)");
      case 1:
        uVar2 = *(uint32_t *)(*in_RDX + 8);
        uVar3 = *(uint32_t *)(*in_RDX + 0xc);
        this_00 = (ImageT<unsigned_short,_1U> *)operator_new(0x28);
        ImageT<unsigned_short,_1U>::ImageT(this_00,uVar2,uVar3);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_00;
        (**(code **)(*(long *)*in_RDX + 0xb0))((long *)*in_RDX,this_00,local_48,local_50);
        break;
      case 2:
        uVar2 = *(uint32_t *)(*in_RDX + 8);
        uVar3 = *(uint32_t *)(*in_RDX + 0xc);
        this_02 = (ImageT<unsigned_short,_2U> *)operator_new(0x28);
        ImageT<unsigned_short,_2U>::ImageT(this_02,uVar2,uVar3);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_02;
        (**(code **)(*(long *)*in_RDX + 0xb8))((long *)*in_RDX,this_02,local_48,local_50);
        break;
      case 3:
        uVar2 = *(uint32_t *)(*in_RDX + 8);
        uVar3 = *(uint32_t *)(*in_RDX + 0xc);
        this_06 = (ImageT<unsigned_short,_3U> *)operator_new(0x28);
        ImageT<unsigned_short,_3U>::ImageT(this_06,uVar2,uVar3);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_06;
        (**(code **)(*(long *)*in_RDX + 0xc0))((long *)*in_RDX,this_06,local_48,local_50);
        break;
      case 4:
        uVar2 = *(uint32_t *)(*in_RDX + 8);
        uVar3 = *(uint32_t *)(*in_RDX + 0xc);
        this_04 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
        ImageT<unsigned_short,_4U>::ImageT(this_04,uVar2,uVar3);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_04;
        (**(code **)(*(long *)*in_RDX + 200))((long *)*in_RDX,this_04,local_48,local_50);
        break;
      default:
switchD_00110cb4_default:
        this_08 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_08,"Out of memory for image with new target type.");
        __cxa_throw(this_08,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      switch(uVar1) {
      case 0:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x49c,"unique_ptr<Image> toktxApp::convertImageType(unique_ptr<Image>)");
      case 1:
        uVar2 = *(uint32_t *)(*in_RDX + 8);
        uVar3 = *(uint32_t *)(*in_RDX + 0xc);
        this_01 = (ImageT<unsigned_char,_1U> *)operator_new(0x28);
        ImageT<unsigned_char,_1U>::ImageT(this_01,uVar2,uVar3);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_01;
        (**(code **)(*(long *)*in_RDX + 0xb0))((long *)*in_RDX,this_01,local_48,local_50);
        break;
      case 2:
        uVar2 = *(uint32_t *)(*in_RDX + 8);
        uVar3 = *(uint32_t *)(*in_RDX + 0xc);
        this_03 = (ImageT<unsigned_char,_2U> *)operator_new(0x28);
        ImageT<unsigned_char,_2U>::ImageT(this_03,uVar2,uVar3);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_03;
        (**(code **)(*(long *)*in_RDX + 0xb8))((long *)*in_RDX,this_03,local_48,local_50);
        break;
      case 3:
        uVar2 = *(uint32_t *)(*in_RDX + 8);
        uVar3 = *(uint32_t *)(*in_RDX + 0xc);
        this_07 = (ImageT<unsigned_char,_3U> *)operator_new(0x28);
        ImageT<unsigned_char,_3U>::ImageT(this_07,uVar2,uVar3);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_07;
        (**(code **)(*(long *)*in_RDX + 0xc0))((long *)*in_RDX,this_07,local_48,local_50);
        break;
      case 4:
        uVar2 = *(uint32_t *)(*in_RDX + 8);
        uVar3 = *(uint32_t *)(*in_RDX + 0xc);
        this_05 = (ImageT<unsigned_char,_4U> *)operator_new(0x28);
        ImageT<unsigned_char,_4U>::ImageT(this_05,uVar2,uVar3);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_05;
        (**(code **)(*(long *)*in_RDX + 200))((long *)*in_RDX,this_05,local_48,local_50);
        break;
      default:
        goto switchD_00110cb4_default;
      }
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

unique_ptr<Image>
toktxApp::convertImageType(unique_ptr<Image> pImage)
{
    // TODO: These copyTo's should be reversed. The image should have
    // a copy constructor for each componentCount src image.
    if (options.targetType != (int)pImage->getComponentCount()) {
        unique_ptr<Image> newImage;
        string nullSwizzle = "rgba";
        // The casts in the following copyTo* definitions only work
        // because, thanks to the switch, at runtime we always pass
        // the image type being cast to.
        if (pImage->getComponentSize() == 2) {
            switch (options.targetType) {
              case commandOptions::eR:
                newImage = make_unique<r16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToR(*newImage, nullSwizzle);
                break;
              case commandOptions::eRG:
                newImage = make_unique<rg16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRG(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGB:
                newImage = make_unique<rgb16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGB(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGBA:
                newImage = make_unique<rgba16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGBA(*newImage, nullSwizzle);
                break;
              case commandOptions::eUnspecified:
                assert(false);
            }
        } else {
            switch (options.targetType) {
              case commandOptions::eR:
                newImage = make_unique<r8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToR(*newImage, nullSwizzle);
                break;
              case commandOptions::eRG:
                newImage = make_unique<rg8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRG(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGB:
                newImage = make_unique<rgb8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGB(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGBA:
                newImage = make_unique<rgba8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGBA(*newImage, nullSwizzle);
                break;
              case commandOptions::eUnspecified:
                assert(false);
            }
        }
        if (newImage) {
             return newImage;
        } else {
            throw runtime_error(
                "Out of memory for image with new target type."
            );
        }
    }
    return pImage;
}